

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

void xmlXPathDebugDumpCompExpr(FILE *output,xmlXPathCompExprPtr comp,int depth)

{
  undefined1 local_88 [8];
  char shift [100];
  int i;
  int depth_local;
  xmlXPathCompExprPtr comp_local;
  FILE *output_local;
  
  if ((output != (FILE *)0x0) && (comp != (xmlXPathCompExprPtr)0x0)) {
    shift[0x60] = '\0';
    shift[0x61] = '\0';
    shift[0x62] = '\0';
    shift[99] = '\0';
    for (; (int)shift._96_4_ < depth && (int)shift._96_4_ < 0x19; shift._96_4_ = shift._96_4_ + 1) {
      local_88[shift._96_4_ * 2 + 1] = 0x20;
      local_88[(int)(shift._96_4_ << 1)] = 0x20;
    }
    local_88[shift._96_4_ * 2 + 1] = 0;
    local_88[(int)(shift._96_4_ << 1)] = 0;
    fprintf((FILE *)output,"%s",local_88);
    fprintf((FILE *)output,"Compiled Expression : %d elements\n",(ulong)(uint)comp->nbStep);
    shift._96_4_ = comp->last;
    xmlXPathDebugDumpStepOp(output,comp,comp->steps + (int)shift._96_4_,depth + 1);
  }
  return;
}

Assistant:

void
xmlXPathDebugDumpCompExpr(FILE *output, xmlXPathCompExprPtr comp,
	                  int depth) {
    int i;
    char shift[100];

    if ((output == NULL) || (comp == NULL)) return;

    for (i = 0;((i < depth) && (i < 25));i++)
        shift[2 * i] = shift[2 * i + 1] = ' ';
    shift[2 * i] = shift[2 * i + 1] = 0;

    fprintf(output, "%s", shift);

#ifdef XPATH_STREAMING
    if (comp->stream) {
        fprintf(output, "Streaming Expression\n");
    } else
#endif
    {
        fprintf(output, "Compiled Expression : %d elements\n",
                comp->nbStep);
        i = comp->last;
        xmlXPathDebugDumpStepOp(output, comp, &comp->steps[i], depth + 1);
    }
}